

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall
helics::ValueFederate::registerValueInterfacesJsonDetail
          (ValueFederate *this,JsonBuffer *jsonBuff,bool defaultGlobal)

{
  string_view target;
  string_view defVal;
  string_view defVal_00;
  string_view defVal_01;
  string_view defVal_02;
  string_view defVal_03;
  string_view defVal_04;
  string_view defVal_05;
  string_view defVal_06;
  string_view type_00;
  string_view type_01;
  string_view name_00;
  string_view name_01;
  string_view units_00;
  string_view units_01;
  string_view key;
  string_view key_00;
  string_view type_02;
  string_view type_03;
  string_view type_04;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view units_02;
  string_view units_03;
  string_view units_04;
  string_view key_01;
  ulong uVar1;
  json *pjVar2;
  byte bVar3;
  bool bVar4;
  undefined1 uVar5;
  byte bVar6;
  pointer pVVar7;
  Input *pIVar8;
  const_reference jref;
  byte in_DL;
  ValueFederate *in_RSI;
  anon_class_8_1_ba1d534b addSourceTarget_1;
  string defStr_1;
  bool global_1;
  string units_2;
  string type_2;
  Input *inp;
  string name_2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *ipt;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  value_type *__range2_2;
  value_type *ipts;
  anon_class_8_1_6bff8b70 addSourceTarget;
  string defStr;
  string units_1;
  string type_1;
  Input *subAct;
  string name_1;
  bool skipNameTarget;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *sub;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  value_type *__range2_1;
  value_type *subs;
  anon_class_8_1_66e10193 addDestTarget;
  bool global;
  string units;
  string type;
  Publication *pubAct;
  string name;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *pub;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  value_type *pubs;
  json *iface;
  json *json;
  string *in_stack_fffffffffffff498;
  Input *in_stack_fffffffffffff4a0;
  json *in_stack_fffffffffffff4a8;
  string *in_stack_fffffffffffff4b0;
  ValueFederateManager *in_stack_fffffffffffff4b8;
  string *in_stack_fffffffffffff4c0;
  json *in_stack_fffffffffffff4c8;
  ValueFederateManager *in_stack_fffffffffffff4d0;
  allocator<char> *in_stack_fffffffffffff4d8;
  ValueFederateManager *in_stack_fffffffffffff4e0;
  allocator<char> *in_stack_fffffffffffff4e8;
  Input *in_stack_fffffffffffff4f0;
  Input *in_stack_fffffffffffff4f8;
  undefined7 in_stack_fffffffffffff500;
  undefined1 in_stack_fffffffffffff507;
  size_t in_stack_fffffffffffff510;
  allocator<char> *paVar9;
  char *in_stack_fffffffffffff518;
  ValueFederateManager *pVVar10;
  ValueFederateManager *in_stack_fffffffffffff528;
  allocator<char> *in_stack_fffffffffffff530;
  ValueFederateManager *in_stack_fffffffffffff538;
  ValueFederate *in_stack_fffffffffffff540;
  ValueFederate *this_00;
  undefined7 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54f;
  char *in_stack_fffffffffffff550;
  char *pcVar11;
  size_t in_stack_fffffffffffff558;
  char *in_stack_fffffffffffff560;
  ValueFederateManager *in_stack_fffffffffffff570;
  allocator<char> *in_stack_fffffffffffff578;
  ValueFederateManager *in_stack_fffffffffffff588;
  string *in_stack_fffffffffffff590;
  ValueFederateManager *in_stack_fffffffffffff598;
  anon_class_8_1_ba1d534b in_stack_fffffffffffff5a0;
  json *local_948;
  JsonBuffer local_928;
  Input *local_920;
  string local_911;
  allocator<char> local_8e9 [25];
  Input *in_stack_fffffffffffff730;
  Input *in_stack_fffffffffffff738;
  ValueFederate *in_stack_fffffffffffff740;
  allocator<char> local_891 [33];
  Input *local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  allocator<char> local_849 [65];
  __sv_type local_808;
  __sv_type local_7f8;
  __sv_type local_7e8;
  __sv_type local_7d8;
  __sv_type local_7c8;
  __sv_type local_7b8;
  allocator<char> local_7a1 [39];
  byte local_77a;
  allocator<char> local_779 [33];
  undefined8 local_758;
  undefined8 uStack_750;
  allocator<char> local_739 [65];
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined1 local_6e1 [81];
  Input *local_690;
  char local_688 [32];
  ValueFederateManager *local_668;
  const_reference local_620;
  const_reference local_618;
  Input *local_610;
  allocator<char> local_601 [40];
  allocator<char> local_5d9 [33];
  Input *local_5b8;
  allocator<char> local_5a9 [40];
  string local_581;
  Input *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined1 local_539 [81];
  __sv_type local_4e8;
  __sv_type local_4d8;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  allocator<char> local_4a9 [33];
  undefined8 local_488;
  undefined8 uStack_480;
  allocator<char> local_469 [88];
  allocator<char> local_411 [65];
  __sv_type local_3d0;
  Input *local_3c0;
  allocator<char> local_3b1 [72];
  byte local_369;
  ValueFederateManager *local_368;
  const_reference local_320;
  const_reference local_318;
  Publication *local_310;
  allocator<char> local_301 [40];
  allocator<char> local_2d9 [33];
  Publication *local_2b8;
  allocator<char> local_2a9 [40];
  allocator<char> local_281 [33];
  Publication *local_260;
  __sv_type local_258;
  __sv_type local_248;
  __sv_type local_238;
  __sv_type local_228;
  __sv_type local_218;
  __sv_type local_208;
  allocator<char> local_1f1 [39];
  undefined1 local_1ca;
  allocator<char> local_1c9 [33];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  allocator<char> local_189 [65];
  undefined8 local_148;
  undefined8 uStack_140;
  allocator<char> local_131 [65];
  __sv_type local_f0;
  Publication *local_e0;
  reference local_b8;
  const_reference local_70;
  const_reference local_68;
  json *local_60;
  allocator<char> local_41 [40];
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar3 = in_DL & 1;
  register0x00000000 = fileops::JsonBuffer::json_abi_cxx11_((JsonBuffer *)in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
             (allocator<char> *)in_stack_fffffffffffff4d0);
  fileops::replaceIfMember
            ((json *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,(bool *)0x28cfe7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4a0);
  std::allocator<char>::~allocator(local_41);
  bVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[11],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff4c0,&in_stack_fffffffffffff4b8->useJsonSerialization);
  if (bVar4) {
    local_948 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8);
  }
  else {
    local_948 = stack0xffffffffffffffe0;
  }
  local_60 = local_948;
  bVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[13],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff4c0,&in_stack_fffffffffffff4b8->useJsonSerialization);
  if (bVar4) {
    local_70 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8);
    local_68 = local_70;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffff498);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)in_stack_fffffffffffff498);
    while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff4a0,
                              (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff498), bVar4) {
      local_b8 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)in_stack_fffffffffffff528);
      fileops::getName(in_stack_fffffffffffff4a8);
      std::
      unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>::
      operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                  *)0x28d12f);
      local_f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff4a0);
      key._M_str = &in_stack_fffffffffffff538->useJsonSerialization;
      key._M_len = (size_t)in_stack_fffffffffffff530;
      local_e0 = ValueFederateManager::getPublication(in_stack_fffffffffffff528,key);
      bVar4 = Interface::isValid((Interface *)0x28d198);
      if (!bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        local_148 = 0;
        uStack_140 = 0;
        defVal._M_str = (char *)in_stack_fffffffffffff4d8;
        defVal._M_len = (size_t)in_stack_fffffffffffff4d0;
        fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_131);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        local_1a8 = 0;
        uStack_1a0 = 0;
        defVal_00._M_str = (char *)in_stack_fffffffffffff4d8;
        defVal_00._M_len = (size_t)in_stack_fffffffffffff4d0;
        fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_189);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8,
                   in_stack_fffffffffffff4b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_1c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        bVar4 = fileops::getOrDefault
                          ((json *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,false);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_1f1);
        local_1ca = bVar4;
        if (bVar4) {
          local_208 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_218 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_228 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          name_00._M_str._0_7_ = in_stack_fffffffffffff500;
          name_00._M_len = (size_t)in_stack_fffffffffffff4f8;
          name_00._M_str._7_1_ = in_stack_fffffffffffff507;
          type_00._M_str = (char *)in_stack_fffffffffffff4f0;
          type_00._M_len = (size_t)in_stack_fffffffffffff4e8;
          units_00._M_str = in_stack_fffffffffffff518;
          units_00._M_len = in_stack_fffffffffffff510;
          in_stack_fffffffffffff498 = (string *)local_228._M_len;
          in_stack_fffffffffffff4a0 = (Input *)local_228._M_str;
          local_e0 = registerGlobalPublication
                               ((ValueFederate *)in_stack_fffffffffffff4e0,name_00,type_00,units_00)
          ;
        }
        else {
          local_238 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_248 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_258 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          name_02._M_str = in_stack_fffffffffffff560;
          name_02._M_len = in_stack_fffffffffffff558;
          type_02._M_len._7_1_ = in_stack_fffffffffffff54f;
          type_02._M_len._0_7_ = in_stack_fffffffffffff548;
          type_02._M_str = in_stack_fffffffffffff550;
          units_02._M_str = (char *)in_stack_fffffffffffff578;
          units_02._M_len = (size_t)in_stack_fffffffffffff570;
          in_stack_fffffffffffff498 = (string *)local_258._M_len;
          in_stack_fffffffffffff4a0 = (Input *)local_258._M_str;
          local_e0 = registerPublication(in_stack_fffffffffffff540,name_02,type_02,units_02);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
      }
      loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Publication>
                (in_stack_fffffffffffff740,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff738,(Publication *)in_stack_fffffffffffff730);
      local_260 = local_e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      local_2b8 = local_260;
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (string *)in_stack_fffffffffffff588,
                 (anon_class_8_1_66e10193)in_stack_fffffffffffff5a0.inp);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_2a9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      local_310 = local_260;
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (string *)in_stack_fffffffffffff588,
                 (anon_class_8_1_66e10193)in_stack_fffffffffffff5a0.inp);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_301);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_2d9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffff4a0);
    }
  }
  bVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[14],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff4c0,&in_stack_fffffffffffff4b8->useJsonSerialization);
  if (bVar4) {
    local_320 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8);
    local_318 = local_320;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffff498);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)in_stack_fffffffffffff498);
    while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff4a0,
                              (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff498), bVar4) {
      local_368 = (ValueFederateManager *)
                  nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff528);
      local_369 = 0;
      fileops::getName(in_stack_fffffffffffff4a8);
      bVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28db15);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8,
                   in_stack_fffffffffffff4b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_3b1);
        local_369 = 1;
      }
      std::
      unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>::
      operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                  *)0x28dbfe);
      local_3d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff4a0);
      key_01._M_str = &in_stack_fffffffffffff598->useJsonSerialization;
      key_01._M_len = (size_t)in_stack_fffffffffffff590;
      local_3c0 = ValueFederateManager::getInputByTarget(in_stack_fffffffffffff588,key_01);
      bVar4 = Interface::isValid((Interface *)0x28dc67);
      if (!bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        local_469[0x41] = (allocator<char>)0x0;
        local_469[0x42] = (allocator<char>)0x0;
        local_469[0x43] = (allocator<char>)0x0;
        local_469[0x44] = (allocator<char>)0x0;
        local_469[0x45] = (allocator<char>)0x0;
        local_469[0x46] = (allocator<char>)0x0;
        local_469[0x47] = (allocator<char>)0x0;
        local_469[0x48] = (allocator<char>)0x0;
        local_469[0x49] = (allocator<char>)0x0;
        local_469[0x4a] = (allocator<char>)0x0;
        local_469[0x4b] = (allocator<char>)0x0;
        local_469[0x4c] = (allocator<char>)0x0;
        local_469[0x4d] = (allocator<char>)0x0;
        local_469[0x4e] = (allocator<char>)0x0;
        local_469[0x4f] = (allocator<char>)0x0;
        local_469[0x50] = (allocator<char>)0x0;
        defVal_01._M_str = (char *)in_stack_fffffffffffff4d8;
        defVal_01._M_len = (size_t)in_stack_fffffffffffff4d0;
        fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal_01);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_411);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        local_488 = 0;
        uStack_480 = 0;
        defVal_02._M_str = (char *)in_stack_fffffffffffff4d8;
        defVal_02._M_len = (size_t)in_stack_fffffffffffff4d0;
        fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal_02);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_469);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8,
                   in_stack_fffffffffffff4b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_4a9);
        local_4c8 = 0;
        uStack_4c0 = 0;
        local_4d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff4a0);
        local_4e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff4a0);
        name_03._M_str = in_stack_fffffffffffff560;
        name_03._M_len = in_stack_fffffffffffff558;
        type_03._M_len._7_1_ = in_stack_fffffffffffff54f;
        type_03._M_len._0_7_ = in_stack_fffffffffffff548;
        type_03._M_str = in_stack_fffffffffffff550;
        units_03._M_str = (char *)in_stack_fffffffffffff578;
        units_03._M_len = (size_t)in_stack_fffffffffffff570;
        in_stack_fffffffffffff498 = (string *)local_4e8._M_len;
        in_stack_fffffffffffff4a0 = (Input *)local_4e8._M_str;
        local_3c0 = registerInput(in_stack_fffffffffffff540,name_03,type_03,units_03);
        if ((local_369 & 1) == 0) {
          local_539._65_16_ =
               (undefined1  [16])
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff4a0);
          target._M_str = (char *)in_stack_fffffffffffff4b0;
          target._M_len = (size_t)in_stack_fffffffffffff4a8;
          Input::addTarget(in_stack_fffffffffffff4a0,target);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
      }
      in_stack_fffffffffffff5a0.inp = (Input *)local_539;
      in_stack_fffffffffffff598 = local_368;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      local_558 = 0;
      uStack_550 = 0;
      defVal_03._M_str = (char *)in_stack_fffffffffffff4d8;
      defVal_03._M_len = (size_t)in_stack_fffffffffffff4d0;
      fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal_03);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator((allocator<char> *)local_539);
      bVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28e10a);
      if (!bVar4) {
        Input::setDefault<std::__cxx11::string&>
                  (in_stack_fffffffffffff4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff498);
      }
      loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>
                (in_stack_fffffffffffff740,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
      local_560 = local_3c0;
      in_stack_fffffffffffff590 = &local_581;
      in_stack_fffffffffffff588 = local_368;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      local_5b8 = local_560;
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__1>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (string *)in_stack_fffffffffffff588,
                 (anon_class_8_1_6bff8b70)in_stack_fffffffffffff5a0.inp);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_5a9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_581);
      in_stack_fffffffffffff578 = local_5d9;
      in_stack_fffffffffffff570 = local_368;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      local_610 = local_560;
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__1>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (string *)in_stack_fffffffffffff588,
                 (anon_class_8_1_6bff8b70)in_stack_fffffffffffff5a0.inp);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_601);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_5d9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffff4a0);
    }
  }
  bVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff4c0,&in_stack_fffffffffffff4b8->useJsonSerialization);
  if (bVar4) {
    local_620 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8);
    local_618 = local_620;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffff498);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)in_stack_fffffffffffff498);
    while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff4a0,
                              (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff498), bVar4) {
      local_668 = (ValueFederateManager *)
                  nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff528);
      pcVar11 = local_688;
      fileops::getName(in_stack_fffffffffffff4a8);
      pVVar7 = std::
               unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
               ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                             *)0x28e585);
      local_6e1._65_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff4a0);
      key_00._M_str = &in_stack_fffffffffffff538->useJsonSerialization;
      key_00._M_len = (size_t)in_stack_fffffffffffff530;
      pIVar8 = ValueFederateManager::getInput(in_stack_fffffffffffff528,key_00);
      local_690 = pIVar8;
      uVar5 = Interface::isValid((Interface *)0x28e5ee);
      if (!(bool)uVar5) {
        this_00 = (ValueFederate *)local_6e1;
        in_stack_fffffffffffff538 = local_668;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        local_6f8 = 0;
        uStack_6f0 = 0;
        defVal_04._M_str = (char *)in_stack_fffffffffffff4d8;
        defVal_04._M_len = (size_t)in_stack_fffffffffffff4d0;
        fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal_04);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator((allocator<char> *)local_6e1);
        in_stack_fffffffffffff530 = local_739;
        in_stack_fffffffffffff528 = local_668;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        local_758 = 0;
        uStack_750 = 0;
        defVal_05._M_str = (char *)in_stack_fffffffffffff4d8;
        defVal_05._M_len = (size_t)in_stack_fffffffffffff4d0;
        fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal_05);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_739);
        pVVar10 = local_668;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8,
                   in_stack_fffffffffffff4b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_779);
        paVar9 = local_7a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   (allocator<char> *)in_stack_fffffffffffff4d0);
        bVar6 = fileops::getOrDefault
                          ((json *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,false);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::allocator<char>::~allocator(local_7a1);
        local_77a = bVar6 & 1;
        if (local_77a == 0) {
          local_7e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_7f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_808 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          name_04._M_str = (char *)pIVar8;
          name_04._M_len = (size_t)pVVar7;
          type_04._M_len._7_1_ = uVar5;
          type_04._M_len._0_7_ = in_stack_fffffffffffff548;
          type_04._M_str = pcVar11;
          units_04._M_str = (char *)in_stack_fffffffffffff578;
          units_04._M_len = (size_t)in_stack_fffffffffffff570;
          in_stack_fffffffffffff498 = (string *)local_808._M_len;
          in_stack_fffffffffffff4a0 = (Input *)local_808._M_str;
          in_stack_fffffffffffff4f0 = registerInput(this_00,name_04,type_04,units_04);
          local_690 = in_stack_fffffffffffff4f0;
        }
        else {
          local_7b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_7c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          local_7d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4a0);
          name_01._M_str._0_7_ = in_stack_fffffffffffff500;
          name_01._M_len = (size_t)in_stack_fffffffffffff4f8;
          name_01._M_str._7_1_ = bVar6;
          type_01._M_str = (char *)in_stack_fffffffffffff4f0;
          type_01._M_len = (size_t)in_stack_fffffffffffff4e8;
          units_01._M_str = &pVVar10->useJsonSerialization;
          units_01._M_len = (size_t)paVar9;
          in_stack_fffffffffffff498 = (string *)local_7d8._M_len;
          in_stack_fffffffffffff4a0 = (Input *)local_7d8._M_str;
          in_stack_fffffffffffff4f8 =
               registerGlobalInput((ValueFederate *)in_stack_fffffffffffff4e0,name_01,type_01,
                                   units_01);
          local_690 = in_stack_fffffffffffff4f8;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4a0);
      }
      in_stack_fffffffffffff4e8 = local_849;
      in_stack_fffffffffffff4e0 = local_668;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      local_868 = 0;
      uStack_860 = 0;
      defVal_06._M_str = (char *)in_stack_fffffffffffff4d8;
      defVal_06._M_len = (size_t)in_stack_fffffffffffff4d0;
      fileops::getOrDefault(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,defVal_06);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_849);
      bVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28ebbe);
      if (!bVar4) {
        Input::setDefault<std::__cxx11::string&>
                  (in_stack_fffffffffffff4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff498);
      }
      loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>
                (in_stack_fffffffffffff740,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
      local_870 = local_690;
      in_stack_fffffffffffff4d8 = local_891;
      in_stack_fffffffffffff4d0 = local_668;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff4c8 = (json *)&stack0xfffffffffffff747;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff738 = local_870;
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__2>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (string *)in_stack_fffffffffffff588,in_stack_fffffffffffff5a0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff747);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_891);
      in_stack_fffffffffffff4c0 = (string *)local_8e9;
      in_stack_fffffffffffff4b8 = local_668;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff4b0 = &local_911;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                 (allocator<char> *)in_stack_fffffffffffff4d0);
      local_920 = local_870;
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__2>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (string *)in_stack_fffffffffffff588,in_stack_fffffffffffff5a0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_911);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::allocator<char>::~allocator(local_8e9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4a0);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffff4a0);
    }
  }
  bVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff4c0,&in_stack_fffffffffffff4b8->useJsonSerialization);
  if (bVar4) {
    jref = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8);
    fileops::JsonBuffer::JsonBuffer(&local_928,jref);
    pjVar2 = stack0xffffffffffffffe0;
    uVar1 = (ulong)stack0xffffffffffffffe0 >> 0x38;
    bVar4 = SUB81(uVar1,0);
    unique0x100023b8 = pjVar2;
    registerValueInterfacesJsonDetail
              (in_RSI,(JsonBuffer *)CONCAT17(bVar3,in_stack_ffffffffffffffe8),bVar4);
  }
  return;
}

Assistant:

void ValueFederate::registerValueInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuff,
                                                      bool defaultGlobal)
{
    const auto& json = jsonBuff.json();
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("publications")) {
        const auto& pubs = iface["publications"];
        for (const auto& pub : pubs) {
            auto name = fileops::getName(pub);

            Publication* pubAct = &vfManager->getPublication(name);
            if (!pubAct->isValid()) {
                auto type = fileops::getOrDefault(pub, "type", emptyStr);
                auto units = fileops::getOrDefault(pub, "unit", emptyStr);
                fileops::replaceIfMember(pub, "units", units);
                const bool global = fileops::getOrDefault(pub, "global", defaultGlobal);
                if (global) {
                    pubAct = &registerGlobalPublication(name, type, units);
                } else {
                    pubAct = &registerPublication(name, type, units);
                }
            }

            loadOptions(this, pub, *pubAct);
            auto addDestTarget = [pubAct](const std::string& target) {
                pubAct->addDestinationTarget(target);
            };
            addTargetVariations(pub, "destination", "inputs", addDestTarget);
            addTargetVariations(pub, "destination", "targets", addDestTarget);
        }
    }
    if (iface.contains("subscriptions")) {
        const auto& subs = iface["subscriptions"];
        for (const auto& sub : subs) {
            bool skipNameTarget{false};
            auto name = fileops::getName(sub);
            if (name.empty()) {
                fileops::replaceIfMember(sub, "target", name);
                skipNameTarget = true;
            }
            auto* subAct = &vfManager->getInputByTarget(name);
            if (!subAct->isValid()) {
                auto type = fileops::getOrDefault(sub, "type", emptyStr);
                auto units = fileops::getOrDefault(sub, "unit", emptyStr);
                fileops::replaceIfMember(sub, "units", units);
                subAct = &registerInput(emptyStr, type, units);
                if (!skipNameTarget) {
                    // this check is to prevent some warnings since targets get added later
                    subAct->addTarget(name);
                }
            }
            auto defStr = fileops::getOrDefault(sub, "default", emptyStr);
            if (!defStr.empty()) {
                subAct->setDefault(defStr);
            }
            loadOptions(this, sub, *subAct);
            auto addSourceTarget = [subAct](const std::string& target) {
                subAct->addSourceTarget(target);
            };
            addTargetVariations(sub, "source", "publications", addSourceTarget);
            addTargetVariations(sub, "source", "targets", addSourceTarget);
        }
    }
    if (iface.contains("inputs")) {
        const auto& ipts = iface["inputs"];
        for (const auto& ipt : ipts) {
            auto name = fileops::getName(ipt);

            Input* inp = &vfManager->getInput(name);
            if (!inp->isValid()) {
                auto type = fileops::getOrDefault(ipt, "type", emptyStr);
                auto units = fileops::getOrDefault(ipt, "unit", emptyStr);
                fileops::replaceIfMember(ipt, "units", units);
                const bool global = fileops::getOrDefault(ipt, "global", defaultGlobal);
                if (global) {
                    inp = &registerGlobalInput(name, type, units);
                } else {
                    inp = &registerInput(name, type, units);
                }
            }
            auto defStr = fileops::getOrDefault(ipt, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, ipt, *inp);
            auto addSourceTarget = [inp](const std::string& target) {
                inp->addSourceTarget(target);
            };
            addTargetVariations(ipt, "source", "publications", addSourceTarget);
            addTargetVariations(ipt, "source", "targets", addSourceTarget);
        }
    }

    if (json.contains("helics")) {
        registerValueInterfacesJsonDetail(json["helics"], defaultGlobal);
    }
}